

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_struct.h
# Opt level: O0

void __thiscall t_struct::validate_union_member(t_struct *this,t_field *field)

{
  e_req eVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  t_const_value *ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *__rhs;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  t_field *local_18;
  t_field *field_local;
  t_struct *this_local;
  
  if (((this->is_union_ & 1U) != 0) &&
     (local_18 = field, field_local = (t_field *)this, uVar2 = std::__cxx11::string::empty(),
     (uVar2 & 1) == 0)) {
    eVar1 = t_field::get_req(local_18);
    if (eVar1 != T_OPTIONAL) {
      eVar1 = t_field::get_req(local_18);
      if (eVar1 != T_OPT_IN_REQ_OUT) {
        uVar3 = std::__cxx11::string::c_str();
        t_field::get_name_abi_cxx11_(local_18);
        uVar4 = std::__cxx11::string::c_str();
        pwarning(1,
                 "Union %s field %s: union members must be optional, ignoring specified requiredness.\n"
                 ,uVar3,uVar4);
      }
      t_field::set_req(local_18,T_OPTIONAL);
    }
    ptVar5 = t_field::get_value(local_18);
    if ((ptVar5 != (t_const_value *)0x0) &&
       (iVar6 = this->members_with_value + 1, this->members_with_value = iVar6, 1 < iVar6)) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      __rhs = t_field::get_name_abi_cxx11_(local_18);
      std::operator+(&local_58,"Error: Field ",__rhs);
      std::operator+(&local_38,&local_58," provides another default value for union ");
      std::operator+(__return_storage_ptr__,&local_38,&(this->super_t_type).name_);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void validate_union_member(t_field* field) {
    if (is_union_ && (!name_.empty())) {

      // 1) unions can't have required fields
      // 2) union members are implicitly optional, otherwise bugs like THRIFT-3650 wait to happen
      if (field->get_req() != t_field::T_OPTIONAL) {
        // no warning on default requiredness, but do warn on anything else that is explicitly asked for
        if(field->get_req() != t_field::T_OPT_IN_REQ_OUT) {
          pwarning(1,
                   "Union %s field %s: union members must be optional, ignoring specified requiredness.\n",
                   name_.c_str(),
                   field->get_name().c_str());
        }
        field->set_req(t_field::T_OPTIONAL);
      }

      // unions may have up to one member defaulted, but not more
      if (field->get_value() != nullptr) {
        if (1 < ++members_with_value) {
          throw "Error: Field " + field->get_name() + " provides another default value for union "
              + name_;
        }
      }
    }
  }